

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O3

string * __thiscall
Catch::StringMaker<std::tuple<int,int,int>,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<std::tuple<int,int,int>,void> *this,
          tuple<int,_int,_int> *tuple)

{
  ReusableStringStream rss;
  char local_29;
  ReusableStringStream local_28;
  
  ReusableStringStream::ReusableStringStream(&local_28);
  local_29 = '{';
  std::__ostream_insert<char,std::char_traits<char>>(local_28.m_oss,&local_29,1);
  Detail::TupleElementPrinter<std::tuple<int,_int,_int>,_0UL,_true>::print
            ((tuple<int,_int,_int> *)this,local_28.m_oss);
  std::__ostream_insert<char,std::char_traits<char>>(local_28.m_oss," }",2);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,&local_28);
  ReusableStringStream::~ReusableStringStream(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(const std::tuple<Types...>& tuple) {
            ReusableStringStream rss;
            rss << '{';
            Detail::TupleElementPrinter<std::tuple<Types...>>::print(tuple, rss.get());
            rss << " }";
            return rss.str();
        }